

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTExecutionInfo.cpp
# Opt level: O2

void __thiscall
TTD::ExecutionInfoManager::AddPreservedBPsForTopLevelLoad
          (ExecutionInfoManager *this,uint32 topLevelBodyId,FunctionBody *body)

{
  List<TTD::TTDebuggerSourceLocation_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_00;
  Type pTVar1;
  ScriptContext *pSVar2;
  Type *ppTVar3;
  int index;
  TTDebuggerSourceLocation *local_50;
  Utf8SourceInfo *local_48;
  FunctionBody *local_40;
  BOOL local_34 [2];
  BOOL isNewBP;
  
  pSVar2 = Js::FunctionProxy::GetScriptContext((FunctionProxy *)body);
  local_48 = (body->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr;
  this_00 = &this->m_unRestoredBreakpoints;
  index = 0;
  local_40 = body;
  do {
    if ((this->m_unRestoredBreakpoints).
        super_ReadOnlyList<TTD::TTDebuggerSourceLocation_*,_Memory::HeapAllocator,_DefaultComparer>.
        count <= index) {
      if ((((this->m_activeTTDBP).m_sourceScriptLogId != 0) && (this->m_activeBPId == -1)) &&
         ((this->m_activeTTDBP).m_topLevelBodyId == topLevelBodyId)) {
        pSVar2 = Js::FunctionProxy::GetScriptContext((FunctionProxy *)local_40);
        SetActiveBP_Helper(this,pSVar2->threadContext->TTDContext);
      }
      return;
    }
    ppTVar3 = JsUtil::
              List<TTD::TTDebuggerSourceLocation_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
              ::Item(this_00,index);
    if (*ppTVar3 != (Type)0x0) {
      ppTVar3 = JsUtil::
                List<TTD::TTDebuggerSourceLocation_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ::Item(this_00,index);
      pTVar1 = *ppTVar3;
      if (pTVar1->m_topLevelBodyId == topLevelBodyId) {
        local_34[0] = 0;
        (*(pSVar2->TTDHostCallbackFunctor).pfOnBPRegisterCallback)
                  ((pSVar2->TTDHostCallbackFunctor).HostRuntime,pTVar1->m_bpId,pSVar2,local_48,
                   pTVar1->m_line,pTVar1->m_column,local_34);
        if (local_34[0] == 0) {
          TTDAbort_unrecoverable_error("We should be restoring a breapoint we removed previously!");
        }
        local_50 = (TTDebuggerSourceLocation *)0x0;
        JsUtil::
        List<TTD::TTDebuggerSourceLocation_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        ::SetItem(this_00,index,&local_50);
      }
    }
    index = index + 1;
  } while( true );
}

Assistant:

void ExecutionInfoManager::AddPreservedBPsForTopLevelLoad(uint32 topLevelBodyId, Js::FunctionBody* body)
    {
        Js::ScriptContext* ctx = body->GetScriptContext();
        Js::Utf8SourceInfo* utf8SourceInfo = body->GetUtf8SourceInfo();

        for(int32 i = 0; i < this->m_unRestoredBreakpoints.Count(); ++i)
        {
            if(this->m_unRestoredBreakpoints.Item(i) == nullptr)
            {
                continue;
            }

            const TTDebuggerSourceLocation* bpLocation = this->m_unRestoredBreakpoints.Item(i);
            if(bpLocation->GetTopLevelBodyId() == topLevelBodyId)
            {
                BOOL isNewBP = FALSE;
                ctx->TTDHostCallbackFunctor.pfOnBPRegisterCallback(ctx->TTDHostCallbackFunctor.HostRuntime, bpLocation->GetBPId(), ctx, utf8SourceInfo, bpLocation->GetSourceLine(), bpLocation->GetSourceColumn(), &isNewBP);
                TTDAssert(isNewBP, "We should be restoring a breapoint we removed previously!");

                //Now that it is set we can clear it from our list
                this->m_unRestoredBreakpoints.SetItem(i, nullptr);
            }
        }

        if(this->m_activeTTDBP.HasValue() && (this->m_activeBPId == -1) && (this->m_activeTTDBP.GetTopLevelBodyId() == topLevelBodyId))
        {
            this->SetActiveBP_Helper(body->GetScriptContext()->GetThreadContext()->TTDContext);
        }
    }